

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<long>
          (AsciiParser *this,char sep,vector<long,_std::allocator<long>_> *result)

{
  pointer plVar1;
  iterator iVar2;
  StreamReader *pSVar3;
  bool bVar4;
  ulong uVar5;
  int iVar6;
  long value;
  long value_1;
  int64_t local_58;
  string local_50;
  
  plVar1 = (result->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  if ((result->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_finish != plVar1) {
    (result->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = plVar1;
  }
  bVar4 = SkipWhitespaceAndNewline(this,true);
  if (bVar4) {
    bVar4 = ReadBasicType(this,&local_58);
    if (bVar4) {
      iVar2._M_current =
           (result->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data
           ._M_finish;
      if (iVar2._M_current ==
          (result->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        ::std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                  ((vector<long,std::allocator<long>> *)result,iVar2,&local_58);
      }
      else {
        *iVar2._M_current = CONCAT71(local_58._1_7_,(char)local_58);
        (result->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar2._M_current + 1;
      }
    }
    else {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Not starting with the value of requested type.\n","");
      PushError(this,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    if (bVar4) {
      do {
        pSVar3 = this->_sr;
        if ((pSVar3->length_ <= pSVar3->idx_) || (pSVar3->binary_[pSVar3->idx_] == '\0'))
        goto LAB_003a3e06;
        bVar4 = SkipWhitespaceAndNewline(this,true);
        if (!bVar4) {
          return false;
        }
        bVar4 = Char1(this,(char *)&local_58);
        iVar6 = 1;
        if (bVar4) {
          if ((char)local_58 == sep) {
            bVar4 = SkipWhitespaceAndNewline(this,true);
            if (bVar4) {
              bVar4 = ReadBasicType(this,(int64_t *)&local_50);
              iVar6 = 3;
              if (bVar4) {
                iVar2._M_current =
                     (result->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar2._M_current ==
                    (result->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  ::std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                            ((vector<long,std::allocator<long>> *)result,iVar2,(long *)&local_50);
                }
                else {
                  *iVar2._M_current = (long)local_50._M_dataplus._M_p;
                  (result->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar2._M_current + 1;
                }
                iVar6 = 0;
              }
            }
          }
          else {
            pSVar3 = this->_sr;
            iVar6 = 3;
            if ((0 < (long)pSVar3->idx_) && (uVar5 = pSVar3->idx_ - 1, uVar5 <= pSVar3->length_)) {
              pSVar3->idx_ = uVar5;
            }
          }
        }
      } while (iVar6 == 0);
      if (iVar6 != 1) {
LAB_003a3e06:
        if ((result->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
            super__Vector_impl_data._M_start !=
            (result->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
            super__Vector_impl_data._M_finish) {
          return true;
        }
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Empty array.\n","");
        PushError(this,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    // sep
    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);
  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}